

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

pair<cmQtAutoGen::IntegerVersion,_unsigned_int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget *target,string *mocExecutable)

{
  int iVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  _Alloc_hider __nptr;
  char cVar4;
  bool bVar5;
  char cVar6;
  char *str;
  cmValue cVar7;
  cmValue cVar8;
  pointer pIVar9;
  IntegerVersion *pIVar10;
  long *plVar11;
  cmTarget *this;
  istream *piVar12;
  int *piVar13;
  IntegerVersion IVar14;
  size_type *psVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  IntegerVersion IVar20;
  ulong uVar21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> pVar22;
  string major;
  unsigned_long tmp;
  int exitCode;
  string capturedStdOut;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> knownQtVersions;
  string mocTargetName;
  uint local_274;
  string local_270;
  cmGeneratorTarget *local_250;
  IntegerVersion local_248;
  undefined8 local_240;
  undefined1 local_238;
  undefined7 uStack_237;
  string *local_228;
  int local_21c;
  string local_218;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> local_1f8;
  IntegerVersion local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  string local_1b0;
  long *local_190 [2];
  long local_180;
  undefined2 local_178;
  ios_base local_138 [264];
  
  local_250 = target;
  local_228 = mocExecutable;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"QT_MAJOR_VERSION","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  str = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty(local_250,&local_1b0,&local_270);
  local_248.Major = 0;
  local_248.Minor = 0;
  local_274 = 0;
  if ((str != (char *)0x0) && (bVar5 = cmStrToULong(str,(unsigned_long *)&local_248), bVar5)) {
    local_274 = local_248.Major;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,(ulong)(local_270.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (&local_1f8,6);
  lVar19 = 0x18;
  do {
    pcVar2 = local_250->Makefile;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,*(long *)(InitScanFiles()::suffixes + lVar19 + 0x10),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 8) +
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x10));
    cVar7 = cmMakefile::GetDefinition(pcVar2,&local_1b0);
    pcVar2 = local_250->Makefile;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x18) +
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19));
    cVar8 = cmMakefile::GetDefinition(pcVar2,&local_270);
    local_248.Major = 0;
    local_248.Minor = 0;
    uVar16 = 0;
    if (cVar7.Value != (string *)0x0) {
      bVar5 = cmStrToULong(cVar7.Value,(unsigned_long *)&local_248);
      uVar16 = 0;
      if (bVar5) {
        uVar16 = local_248.Major;
      }
    }
    local_248.Major = 0;
    local_248.Minor = 0;
    uVar17 = 0;
    if ((cVar8.Value != (string *)0x0) &&
       (bVar5 = cmStrToULong(cVar8.Value,(unsigned_long *)&local_248), bVar5)) {
      uVar17 = local_248.Major;
    }
    local_248.Minor = uVar17;
    local_248.Major = uVar16;
    if (uVar16 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_1f8,&local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x78);
  lVar19 = 0x18;
  do {
    pcVar2 = local_250->Makefile;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,*(long *)(InitScanFiles()::suffixes + lVar19 + 0x10),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 8) +
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x10));
    cVar7 = cmMakefile::GetProperty(pcVar2,&local_1b0);
    pcVar2 = local_250->Makefile;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19),
               *(long *)(InitScanFiles()::suffixes + lVar19 + 0x18) +
               *(long *)((long)&GetQtVersion(cmGeneratorTarget_const*,std::__cxx11::string)::keys +
                        lVar19));
    cVar8 = cmMakefile::GetProperty(pcVar2,&local_270);
    local_248.Major = 0;
    local_248.Minor = 0;
    uVar16 = 0;
    if (cVar7.Value != (string *)0x0) {
      bVar5 = cmStrToULong(cVar7.Value,(unsigned_long *)&local_248);
      uVar16 = 0;
      if (bVar5) {
        uVar16 = local_248.Major;
      }
    }
    local_248.Major = 0;
    local_248.Minor = 0;
    uVar17 = 0;
    if ((cVar8.Value != (string *)0x0) &&
       (bVar5 = cmStrToULong(cVar8.Value,(unsigned_long *)&local_248), uVar17 = 0, bVar5)) {
      uVar17 = local_248.Major;
    }
    local_248.Minor = uVar17;
    local_248.Major = uVar16;
    if (uVar16 != 0) {
      std::vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>>::
      emplace_back<cmQtAutoGen::IntegerVersion&>
                ((vector<cmQtAutoGen::IntegerVersion,std::allocator<cmQtAutoGen::IntegerVersion>> *)
                 &local_1f8,&local_248);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,
                      (ulong)(local_270.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    lVar19 = lVar19 + 0x20;
  } while (lVar19 != 0x78);
  uVar18 = 0;
  if (local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    IVar20.Major = 0;
    IVar20.Minor = 0;
  }
  else {
    pIVar9 = local_1f8.
             super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_274 == 0) {
      if (local_1f8.
          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1f8.
          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      IVar20 = *local_1f8.
                super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (ulong)IVar20 >> 0x20;
    }
    else {
      for (; pIVar9 != local_1f8.
                       super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pIVar9 = pIVar9 + 1) {
        IVar20.Minor = 0;
        IVar20.Major = pIVar9->Major;
        if (pIVar9->Major == local_274) {
          uVar18 = (ulong)pIVar9->Minor;
          goto LAB_002c604e;
        }
      }
      IVar20.Major = 0;
      IVar20.Minor = 0;
    }
  }
LAB_002c604e:
  if (IVar20.Major == 0) {
    if (local_228->_M_string_length == 0) {
      pcVar2 = local_250->Makefile;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      cVar6 = '\x01';
      if (9 < local_274) {
        uVar16 = local_274;
        cVar4 = '\x04';
        do {
          cVar6 = cVar4;
          if (uVar16 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_002c610f;
          }
          if (uVar16 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_002c610f;
          }
          if (uVar16 < 10000) goto LAB_002c610f;
          bVar5 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          cVar4 = cVar6 + '\x04';
        } while (bVar5);
        cVar6 = cVar6 + '\x01';
      }
LAB_002c610f:
      local_248 = (IntegerVersion)&local_238;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_248,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_248,(uint)local_240,local_274);
      pIVar10 = (IntegerVersion *)
                std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x76fc16);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      IVar14 = (IntegerVersion)(pIVar10 + 2);
      if (*pIVar10 == IVar14) {
        local_270.field_2._M_allocated_capacity = *(undefined8 *)IVar14;
        local_270.field_2._8_8_ = pIVar10[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *(undefined8 *)IVar14;
        local_270._M_dataplus._M_p = (pointer)*pIVar10;
      }
      local_270._M_string_length = *(size_type *)(pIVar10 + 1);
      *pIVar10 = IVar14;
      pIVar10[1].Major = 0;
      pIVar10[1].Minor = 0;
      *(undefined1 *)&pIVar10[2].Major = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_1b0.field_2._M_allocated_capacity = *psVar15;
        local_1b0.field_2._8_8_ = plVar11[3];
      }
      else {
        local_1b0.field_2._M_allocated_capacity = *psVar15;
        local_1b0._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1b0._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,
                        (ulong)(local_270.field_2._M_allocated_capacity + 1));
      }
      if (local_248 != (IntegerVersion)&local_238) {
        operator_delete((void *)local_248,CONCAT71(uStack_237,local_238) + 1);
      }
      this = cmMakefile::FindTargetToUse(pcVar2,&local_1b0,false);
      if (this != (cmTarget *)0x0) {
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        local_248.Major = 0x11;
        local_248.Minor = 0;
        local_270._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_270,(ulong)&local_248);
        local_270.field_2._M_allocated_capacity._0_4_ = local_248.Major;
        local_270.field_2._M_allocated_capacity._4_4_ = local_248.Minor;
        *(undefined8 *)local_270._M_dataplus._M_p = 0x444554524f504d49;
        builtin_strncpy((char *)((long)local_270._M_dataplus._M_p + 8),"_LOCATIO",8);
        *(char *)((long)local_270._M_dataplus._M_p + 0x10) = 'N';
        local_270._M_string_length._0_4_ = local_248.Major;
        local_270._M_string_length._4_4_ = local_248.Minor;
        *(char *)((long)local_270._M_dataplus._M_p + (long)local_248) = '\0';
        cmTarget::GetSafeProperty(this,&local_270);
        std::__cxx11::string::_M_assign((string *)&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          (ulong)(local_270.field_2._M_allocated_capacity + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::operator=((string *)local_228,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_228->_M_string_length != 0) {
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      pcVar3 = (local_228->_M_dataplus)._M_p;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,pcVar3,pcVar3 + local_228->_M_string_length);
      plVar11 = &local_180;
      local_180 = 0x6f69737265762d2d;
      local_178 = 0x6e;
      local_190[1] = (long *)0x9;
      __l._M_len = 2;
      __l._M_array = &local_1b0;
      local_190[0] = plVar11;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_270,__l,(allocator_type *)&local_248);
      bVar5 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_270,&local_218,(string *)0x0,&local_21c,(char *)0x0,OUTPUT_NONE,
                         (cmDuration)0x0,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_270);
      lVar19 = -0x40;
      do {
        if (plVar11 != (long *)plVar11[-2]) {
          operator_delete((long *)plVar11[-2],*plVar11 + 1);
        }
        plVar11 = plVar11 + -4;
        lVar19 = lVar19 + 0x20;
      } while (lVar19 != 0);
      if (bVar5 && local_21c == 0) {
        local_1d0[0] = local_1c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1d0,local_218._M_dataplus._M_p,
                   local_218._M_dataplus._M_p + local_218._M_string_length);
        if (parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_ == '\0') {
          GetQtVersion();
        }
        IVar20.Major = 0;
        IVar20.Minor = 0;
        lVar19 = std::__cxx11::string::find
                           ((char *)local_1d0,
                            parseMocVersion(std::__cxx11::string)::prelude_abi_cxx11_,0);
        if (lVar19 != -1) {
          std::__cxx11::string::erase((ulong)local_1d0,0);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&local_1b0,(string *)local_1d0,_S_in);
          local_270._M_string_length._0_4_ = 0;
          local_270._M_string_length._4_4_ = 0;
          local_270.field_2._M_allocated_capacity =
               local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_240 = 0;
          local_238 = 0;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          local_248 = (IntegerVersion)&local_238;
          piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&local_1b0,(string *)&local_270,'.');
          if ((((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) &&
             (piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&local_1b0,(string *)&local_248,'.'),
             __nptr._M_p = local_270._M_dataplus._M_p,
             ((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0)) {
            piVar13 = __errno_location();
            iVar1 = *piVar13;
            *piVar13 = 0;
            local_250._0_4_ = iVar1;
            uVar18 = strtol(__nptr._M_p,(char **)&local_1d8,10);
            IVar20 = local_248;
            if (local_1d8 == (IntegerVersion)__nptr._M_p) {
              std::__throw_invalid_argument("stoi");
LAB_002c66b6:
              std::__throw_out_of_range("stoi");
            }
            if (((long)(int)uVar18 != uVar18) || (*piVar13 == 0x22)) goto LAB_002c66b6;
            if (*piVar13 == 0) {
              *piVar13 = (int)local_250;
            }
            local_250 = (cmGeneratorTarget *)CONCAT44(local_250._4_4_,*piVar13);
            *piVar13 = 0;
            lVar19 = strtol((char *)local_248,(char **)&local_1d8,10);
            if (local_1d8 == IVar20) {
              std::__throw_invalid_argument("stoi");
LAB_002c66ce:
              std::__throw_out_of_range("stoi");
            }
            if ((lVar19 - 0x80000000U < 0xffffffff00000000) || (*piVar13 == 0x22))
            goto LAB_002c66ce;
            if (*piVar13 == 0) {
              *piVar13 = (int)local_250;
            }
            uVar21 = lVar19 << 0x20;
            uVar18 = uVar18 & 0xffffffff;
          }
          else {
            uVar18 = 0;
            uVar21 = 0;
          }
          if (local_248 != (IntegerVersion)&local_238) {
            operator_delete((void *)local_248,CONCAT71(uStack_237,local_238) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            (ulong)(local_270.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
          std::ios_base::~ios_base(local_138);
          IVar20 = (IntegerVersion)(uVar21 | uVar18);
        }
        uVar18 = (ulong)IVar20 >> 0x20;
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0],local_1c0[0] + 1);
        }
      }
      else {
        IVar20.Major = 0;
        IVar20.Minor = 0;
        uVar18 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (local_1f8.
      super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pVar22.first = (IntegerVersion)((ulong)IVar20 & 0xffffffff | uVar18 << 0x20);
  pVar22.second = local_274;
  return pVar22;
}

Assistant:

std::pair<cmQtAutoGen::IntegerVersion, unsigned int>
cmQtAutoGenInitializer::GetQtVersion(cmGeneratorTarget const* target,
                                     std::string mocExecutable)
{
  // Converts a char ptr to an unsigned int value
  auto toUInt = [](const char* const input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };
  auto toUInt2 = [](cmValue input) -> unsigned int {
    unsigned long tmp = 0;
    if (input && cmStrToULong(*input, &tmp)) {
      return static_cast<unsigned int>(tmp);
    }
    return 0u;
  };

  // Initialize return value to a default
  std::pair<IntegerVersion, unsigned int> res(
    IntegerVersion(),
    toUInt(target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION",
                                                           "")));

  // Acquire known Qt versions
  std::vector<cmQtAutoGen::IntegerVersion> knownQtVersions;
  {
    // Qt version variable prefixes
    static std::initializer_list<
      std::pair<cm::string_view, cm::string_view>> const keys{
      { "Qt6Core_VERSION_MAJOR", "Qt6Core_VERSION_MINOR" },
      { "Qt5Core_VERSION_MAJOR", "Qt5Core_VERSION_MINOR" },
      { "QT_VERSION_MAJOR", "QT_VERSION_MINOR" },
    };

    knownQtVersions.reserve(keys.size() * 2);

    // Adds a version to the result (nullptr safe)
    auto addVersion = [&knownQtVersions, &toUInt2](cmValue major,
                                                   cmValue minor) {
      cmQtAutoGen::IntegerVersion ver(toUInt2(major), toUInt2(minor));
      if (ver.Major != 0) {
        knownQtVersions.emplace_back(ver);
      }
    };

    // Read versions from variables
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetDefinition(std::string(keyPair.first)),
                 target->Makefile->GetDefinition(std::string(keyPair.second)));
    }

    // Read versions from directory properties
    for (auto const& keyPair : keys) {
      addVersion(target->Makefile->GetProperty(std::string(keyPair.first)),
                 target->Makefile->GetProperty(std::string(keyPair.second)));
    }
  }

  // Evaluate known Qt versions
  if (!knownQtVersions.empty()) {
    if (res.second == 0) {
      // No specific version was requested by the target:
      // Use highest known Qt version.
      res.first = knownQtVersions.at(0);
    } else {
      // Pick a version from the known versions:
      for (auto it : knownQtVersions) {
        if (it.Major == res.second) {
          res.first = it;
          break;
        }
      }
    }
  }

  if (res.first.Major == 0) {
    // We could not get the version number from variables or directory
    // properties. This might happen if the find_package call for Qt is wrapped
    // in a function. Try to find the moc executable path from the available
    // targets and call "moc --version" to get the Qt version.
    if (mocExecutable.empty()) {
      mocExecutable =
        FindMocExecutableFromMocTarget(target->Makefile, res.second);
    }
    if (!mocExecutable.empty()) {
      res.first = GetMocVersion(mocExecutable);
    }
  }

  return res;
}